

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

_Bool arm_is_el3_or_mon(CPUARMState_conflict *env)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  CPUARMState_conflict *env_local;
  
  iVar2 = arm_feature(env,0x21);
  if (iVar2 != 0) {
    _Var1 = is_a64(env);
    if ((_Var1) && (uVar3 = extract32(env->pstate,2,2), uVar3 == 3)) {
      return true;
    }
    _Var1 = is_a64(env);
    if ((!_Var1) && ((env->uncached_cpsr & 0x1f) == 0x16)) {
      return true;
    }
  }
  return false;
}

Assistant:

static inline bool arm_is_el3_or_mon(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        if (is_a64(env) && extract32(env->pstate, 2, 2) == 3) {
            /* CPU currently in AArch64 state and EL3 */
            return true;
        } else if (!is_a64(env) &&
                (env->uncached_cpsr & CPSR_M) == ARM_CPU_MODE_MON) {
            /* CPU currently in AArch32 state and monitor mode */
            return true;
        }
    }
    return false;
}